

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

CodeLocation __thiscall
soul::SourceCodeUtilities::findStartOfPrecedingComment
          (SourceCodeUtilities *this,CodeLocation *location)

{
  SourceCodeUtilities *this_00;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  SourceCodeText *pSVar6;
  UTF8Reader extraout_RDX;
  CodeLocation CVar7;
  string_view t;
  string_view t_00;
  string_view t_01;
  string_view s;
  string_view s_00;
  string_view s_01;
  string local_118;
  CodeLocation prevLineStart;
  UTF8Reader local_e8;
  string prevLine;
  string local_c0;
  string local_a0;
  CodeLocation next;
  string local_70;
  string local_50;
  
  CodeLocation::getStartOfPreviousLine(&prevLineStart);
  bVar3 = CodeLocation::isEmpty(&prevLineStart);
  if (bVar3) {
    pSVar6 = (location->sourceCode).object;
    pcVar1 = (location->location).data;
    (location->sourceCode).object = (SourceCodeText *)0x0;
    *(SourceCodeText **)this = pSVar6;
    *(char **)(this + 8) = pcVar1;
    goto LAB_00210e39;
  }
  CodeLocation::getSourceLine_abi_cxx11_(&prevLine,&prevLineStart);
  std::__cxx11::string::string((string *)&local_70,(string *)&prevLine);
  choc::text::trimStart(&local_118,&local_70);
  t._M_len._4_4_ = local_118._M_string_length._4_4_;
  t._M_len._0_4_ = (int)local_118._M_string_length;
  t._M_str = local_118._M_dataplus._M_p;
  s._M_str = "//";
  s._M_len = 2;
  bVar3 = choc::text::startsWith(t,s);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar3) {
    *(SourceCodeText **)this = prevLineStart.sourceCode.object;
    if (prevLineStart.sourceCode.object != (SourceCodeText *)0x0) {
      ((prevLineStart.sourceCode.object)->super_RefCountedObject).refCount =
           ((prevLineStart.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    *(char **)(this + 8) = prevLineStart.location.data;
    bVar3 = false;
    do {
      CodeLocation::getStartOfPreviousLine(&next);
      bVar4 = CodeLocation::isEmpty(&next);
      bVar2 = true;
      if (bVar4) {
        bVar4 = true;
      }
      else {
        CodeLocation::getSourceLine_abi_cxx11_(&local_50,&next);
        choc::text::trimStart(&local_118,&local_50);
        t_00._M_len._4_4_ = local_118._M_string_length._4_4_;
        t_00._M_len._0_4_ = (int)local_118._M_string_length;
        t_00._M_str = local_118._M_dataplus._M_p;
        s_00._M_str = "//";
        s_00._M_len = 2;
        bVar5 = choc::text::startsWith(t_00,s_00);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_50);
        bVar4 = true;
        if (bVar5) {
          CodeLocation::operator=((CodeLocation *)this,&next);
          bVar2 = false;
          bVar4 = bVar3;
        }
      }
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&next.sourceCode);
      bVar3 = bVar4;
    } while (!bVar2);
    if (!bVar4) {
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                ((RefCountedPtr<soul::SourceCodeText> *)this);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_a0,(string *)&prevLine);
    choc::text::trimEnd(&local_118,&local_a0);
    t_01._M_len._4_4_ = local_118._M_string_length._4_4_;
    t_01._M_len._0_4_ = (int)local_118._M_string_length;
    t_01._M_str = local_118._M_dataplus._M_p;
    s_01._M_str = "*/";
    s_01._M_len = 2;
    bVar3 = choc::text::endsWith(t_01,s_01);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar3) {
      pSVar6 = RefCountedPtr<soul::SourceCodeText>::operator->(&prevLineStart.sourceCode);
      pcVar1 = (pSVar6->utf8).data;
      *(SourceCodeText **)this = prevLineStart.sourceCode.object;
      if (prevLineStart.sourceCode.object != (SourceCodeText *)0x0) {
        ((prevLineStart.sourceCode.object)->super_RefCountedObject).refCount =
             ((prevLineStart.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      *(char **)(this + 8) = prevLineStart.location.data;
      std::__cxx11::string::string((string *)&local_c0,(string *)&prevLine);
      choc::text::trimEnd(&local_118,&local_c0);
      this_00 = this + 8;
      UTF8Reader::operator+=((UTF8Reader *)this_00,(int)local_118._M_string_length + -2);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_c0);
      local_e8.data = pcVar1;
      UTF8Reader::operator+=(&local_e8,1);
      if (local_e8.data < *(char **)this_00) {
        UTF8Reader::operator--((UTF8Reader *)this_00);
        UTF8Reader::operator--((UTF8Reader *)this_00);
        while( true ) {
          bVar3 = UTF8Reader::startsWith((UTF8Reader *)this_00,"/*");
          if (bVar3) break;
          if (*(char **)this_00 <= pcVar1) goto LAB_00210e10;
          UTF8Reader::operator--((UTF8Reader *)this_00);
        }
        goto LAB_00210e2a;
      }
LAB_00210e10:
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                ((RefCountedPtr<soul::SourceCodeText> *)this);
    }
    pSVar6 = (location->sourceCode).object;
    pcVar1 = (location->location).data;
    (location->sourceCode).object = (SourceCodeText *)0x0;
    *(SourceCodeText **)this = pSVar6;
    *(char **)(this + 8) = pcVar1;
  }
LAB_00210e2a:
  std::__cxx11::string::~string((string *)&prevLine);
LAB_00210e39:
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&prevLineStart.sourceCode);
  CVar7.location.data = extraout_RDX.data;
  CVar7.sourceCode.object = (SourceCodeText *)this;
  return CVar7;
}

Assistant:

CodeLocation SourceCodeUtilities::findStartOfPrecedingComment (CodeLocation location)
{
    auto prevLineStart = location.getStartOfPreviousLine();

    if (prevLineStart.isEmpty())
        return location;

    auto prevLine = prevLineStart.getSourceLine();

    if (choc::text::startsWith (choc::text::trimStart (prevLine), "//"))
    {
        for (auto start = prevLineStart;;)
        {
            auto next = start.getStartOfPreviousLine();

            if (next.isEmpty() || ! choc::text::startsWith (choc::text::trimStart (next.getSourceLine()), "//"))
                return start;

            start = next;
        }
    }

    if (choc::text::endsWith (choc::text::trimEnd (prevLine), "*/"))
    {
        auto fileStart = prevLineStart.sourceCode->utf8;
        auto start = prevLineStart;
        start.location += static_cast<int> (choc::text::trimEnd (prevLine).length() - 2);

        if (start.location > fileStart + 1)
        {
            --(start.location);
            --(start.location);

            for (;;)
            {
                if (start.location.startsWith ("/*"))
                    return start;

                if (start.location > fileStart)
                    --(start.location);
                else
                    break;
            }
        }
    }

    return location;
}